

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshotExtractor.cpp
# Opt level: O0

void __thiscall
TTD::SnapshotExtractor::ExtractTypeIfNeeded
          (SnapshotExtractor *this,Type *jstype,ThreadContext *threadContext)

{
  ThreadContext *this_00;
  bool bVar1;
  DynamicTypeHandler *pDVar2;
  SnapHandler **ppSVar3;
  SnapType *sType_00;
  SlabAllocator *alloc;
  SnapType *local_40;
  SnapType *sType;
  TTD_PTR_ID handlerId;
  DynamicTypeHandler *dhandler;
  SnapHandler *sHandler;
  ThreadContext *threadContext_local;
  Type *jstype_local;
  SnapshotExtractor *this_local;
  
  sHandler = (SnapHandler *)threadContext;
  threadContext_local = (ThreadContext *)jstype;
  jstype_local = (Type *)this;
  bVar1 = MarkTable::IsMarked(&this->m_marks,jstype);
  if (bVar1) {
    dhandler = (DynamicTypeHandler *)0x0;
    bVar1 = Js::DynamicType::Is((Type *)threadContext_local);
    if (bVar1) {
      pDVar2 = Js::DynamicType::GetTypeHandler((DynamicType *)threadContext_local);
      ExtractHandlerIfNeeded(this,pDVar2,(ThreadContext *)sHandler);
      sType = (SnapType *)Js::DynamicType::GetTypeHandler((DynamicType *)threadContext_local);
      handlerId = (TTD_PTR_ID)sType;
      ppSVar3 = TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*>::
                LookupKnownItem(&this->m_idToHandlerMap,(unsigned_long)sType);
      dhandler = (DynamicTypeHandler *)*ppSVar3;
    }
    sType_00 = SnapShot::GetNextAvailableTypeEntry(this->m_pendingSnap);
    this_00 = threadContext_local;
    pDVar2 = dhandler;
    local_40 = sType_00;
    alloc = SnapShot::GetSnapshotSlabAllocator(this->m_pendingSnap);
    Js::Type::ExtractSnapType((Type *)this_00,sType_00,(SnapHandler *)pDVar2,alloc);
    TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*>::AddItem
              (&this->m_idToTypeMap,local_40->TypePtrId,&local_40);
    MarkTable::ClearMark(&this->m_marks,threadContext_local);
  }
  return;
}

Assistant:

void SnapshotExtractor::ExtractTypeIfNeeded(Js::Type* jstype, ThreadContext* threadContext)
    {
        if(this->m_marks.IsMarked(jstype))
        {
            NSSnapType::SnapHandler* sHandler = nullptr;

            if(Js::DynamicType::Is(jstype))
            {
                this->ExtractHandlerIfNeeded(static_cast<Js::DynamicType*>(jstype)->GetTypeHandler(), threadContext);

                Js::DynamicTypeHandler* dhandler = static_cast<const Js::DynamicType*>(jstype)->GetTypeHandler();

                TTD_PTR_ID handlerId = TTD_CONVERT_TYPEINFO_TO_PTR_ID(dhandler);
                sHandler = this->m_idToHandlerMap.LookupKnownItem(handlerId);
            }

            NSSnapType::SnapType* sType = this->m_pendingSnap->GetNextAvailableTypeEntry();
            jstype->ExtractSnapType(sType, sHandler, this->m_pendingSnap->GetSnapshotSlabAllocator());

            this->m_idToTypeMap.AddItem(sType->TypePtrId, sType);
            this->m_marks.ClearMark(jstype);
        }
    }